

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNetlist.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkToNetlistBench(Abc_Ntk_t *pNtk)

{
  long *plVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *pVVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  char *pcVar7;
  ulong uVar8;
  Abc_Ntk_t *pAVar9;
  long lVar10;
  long lVar11;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNetlist.c"
                  ,0x80,"Abc_Ntk_t *Abc_NtkToNetlistBench(Abc_Ntk_t *)");
  }
  iVar2 = Abc_NtkGetChoiceNum(pNtk);
  if (iVar2 != 0) {
    puts("Warning: Choice nodes are skipped.");
  }
  pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
  pVVar3 = Abc_NtkDfs(pNtk,0);
  pAVar4 = Abc_AigConst1(pNtk);
  if (0 < (pAVar4->vFanouts).nSize) {
    pAVar5 = Abc_NtkCreateNodeConst1(pNtk_00);
    (pAVar4->field_6).pCopy = pAVar5;
  }
  iVar2 = Abc_AigNodeHasComplFanoutEdgeTrav(pAVar4);
  if (iVar2 != 0) {
    pAVar5 = Abc_NtkCreateNodeInv(pNtk_00,(pAVar4->field_6).pCopy);
    (((pAVar4->field_6).pCopy)->field_6).pCopy = pAVar5;
  }
  pVVar6 = pNtk->vCis;
  if (0 < pVVar6->nSize) {
    lVar11 = 0;
    do {
      pAVar4 = (Abc_Obj_t *)pVVar6->pArray[lVar11];
      iVar2 = Abc_AigNodeHasComplFanoutEdgeTrav(pAVar4);
      if (iVar2 != 0) {
        pAVar5 = Abc_NtkCreateNodeInv(pNtk_00,(pAVar4->field_6).pCopy);
        (((pAVar4->field_6).pCopy)->field_6).pCopy = pAVar5;
      }
      lVar11 = lVar11 + 1;
      pVVar6 = pNtk->vCis;
    } while (lVar11 < pVVar6->nSize);
  }
  if (0 < pVVar3->nSize) {
    lVar11 = 0;
    do {
      pAVar4 = (Abc_Obj_t *)pVVar3->pArray[lVar11];
      Abc_NtkDupObj(pNtk_00,pAVar4,0);
      pcVar7 = Abc_SopCreateAnd((Mem_Flex_t *)pNtk_00->pManFunc,2,(int *)0x0);
      (((pAVar4->field_6).pCopy)->field_5).pData = pcVar7;
      iVar2 = Abc_AigNodeHasComplFanoutEdgeTrav(pAVar4);
      if (iVar2 != 0) {
        pAVar5 = Abc_NtkCreateNodeInv(pNtk_00,(pAVar4->field_6).pCopy);
        (((pAVar4->field_6).pCopy)->field_6).pCopy = pAVar5;
      }
      lVar11 = lVar11 + 1;
      uVar8 = (ulong)pVVar3->nSize;
    } while (lVar11 < (long)uVar8);
    if (0 < pVVar3->nSize) {
      lVar11 = 0;
      do {
        plVar1 = (long *)pVVar3->pArray[lVar11];
        if (0 < *(int *)((long)plVar1 + 0x1c)) {
          lVar10 = 0;
          do {
            if (lVar10 == 2) {
              __assert_fail("i >=0 && i < 2",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                            ,0x17d,"int Abc_ObjFaninC(Abc_Obj_t *, int)");
            }
            pAVar4 = *(Abc_Obj_t **)
                      (*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                (long)*(int *)(plVar1[4] + lVar10 * 4) * 8) + 0x40);
            if ((*(uint *)((long)plVar1 + 0x14) & (uint)(lVar10 != 0) * 0x400 + 0x400) != 0) {
              pAVar4 = (pAVar4->field_6).pCopy;
            }
            Abc_ObjAddFanin((Abc_Obj_t *)plVar1[8],pAVar4);
            lVar10 = lVar10 + 1;
          } while (lVar10 < *(int *)((long)plVar1 + 0x1c));
          uVar8 = (ulong)(uint)pVVar3->nSize;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < (int)uVar8);
    }
  }
  if (pVVar3->pArray != (void **)0x0) {
    free(pVVar3->pArray);
  }
  free(pVVar3);
  pVVar3 = pNtk->vCos;
  if (0 < pVVar3->nSize) {
    lVar11 = 0;
    do {
      plVar1 = (long *)pVVar3->pArray[lVar11];
      pAVar4 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8) +
                0x40);
      if ((*(byte *)((long)plVar1 + 0x15) & 4) != 0) {
        pAVar4 = (pAVar4->field_6).pCopy;
      }
      Abc_ObjAddFanin((Abc_Obj_t *)plVar1[8],pAVar4);
      lVar11 = lVar11 + 1;
      pVVar3 = pNtk->vCos;
    } while (lVar11 < pVVar3->nSize);
  }
  Abc_NtkLogicMakeSimpleCos(pNtk_00,0);
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    puts("Warning: The EXDc network is skipped.");
  }
  iVar2 = Abc_NtkCheck(pNtk_00);
  if (iVar2 == 0) {
    fwrite("Abc_NtkAigToLogicSopBench(): Network check has failed.\n",0x37,1,_stdout);
  }
  pAVar9 = Abc_NtkLogicToNetlist(pNtk_00);
  Abc_NtkDelete(pNtk_00);
  return pAVar9;
}

Assistant:

Abc_Ntk_t * Abc_NtkAigToLogicSop( Abc_Ntk_t * pNtk )
{
    extern int Abc_NtkLogicMakeSimpleCos2( Abc_Ntk_t * pNtk, int fDuplicate );

    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin, * pNodeNew;
    Vec_Int_t * vInts;
    int i, k, fChoices = 0;
    assert( Abc_NtkIsStrash(pNtk) );
    // start the network
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    // if the constant node is used, duplicate it
    pObj = Abc_AigConst1(pNtk);
    if ( Abc_ObjFanoutNum(pObj) > 0 )
        pObj->pCopy = Abc_NtkCreateNodeConst1(pNtkNew);
    // duplicate the nodes and create node functions
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        Abc_NtkDupObj(pNtkNew, pObj, 0);
        pObj->pCopy->pData = Abc_SopCreateAnd2( (Mem_Flex_t *)pNtkNew->pManFunc, Abc_ObjFaninC0(pObj), Abc_ObjFaninC1(pObj) );
    }
    // create the choice nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        if ( !Abc_AigNodeIsChoice(pObj) )
            continue;
        // create an OR gate
        pNodeNew = Abc_NtkCreateNode(pNtkNew);
        // add fanins
        vInts = Vec_IntAlloc( 10 );
        for ( pFanin = pObj; pFanin; pFanin = (Abc_Obj_t *)pFanin->pData )
        {
            Vec_IntPush( vInts, (int)(pObj->fPhase != pFanin->fPhase) );
            Abc_ObjAddFanin( pNodeNew, pFanin->pCopy );
        }
        // create the logic function
        pNodeNew->pData = Abc_SopCreateOrMultiCube( (Mem_Flex_t *)pNtkNew->pManFunc, Vec_IntSize(vInts), Vec_IntArray(vInts) );
        // set the new node
        pObj->pCopy->pCopy = pNodeNew;
        Vec_IntFree( vInts );
        fChoices = 1;
    }
    // connect the internal nodes
    Abc_NtkForEachNode( pNtk, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            if ( pFanin->pCopy->pCopy )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy->pCopy );
            else
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
    // connect the COs
//    Abc_NtkFinalize( pNtk, pNtkNew );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pFanin = Abc_ObjFanin0(pObj);
        if ( pFanin->pCopy->pCopy )
            pNodeNew = Abc_ObjNotCond(pFanin->pCopy->pCopy, Abc_ObjFaninC0(pObj));
        else
            pNodeNew = Abc_ObjNotCond(pFanin->pCopy, Abc_ObjFaninC0(pObj));
        Abc_ObjAddFanin( pObj->pCopy, pNodeNew );
    }

    // fix the problem with complemented and duplicated CO edges
    if ( fChoices )
        Abc_NtkLogicMakeSimpleCos2( pNtkNew, 0 );
    else
        Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );
    // duplicate the EXDC Ntk
    if ( pNtk->pExdc )
    {
        if ( Abc_NtkIsStrash(pNtk->pExdc) )
            pNtkNew->pExdc = Abc_NtkAigToLogicSop( pNtk->pExdc );
        else
            pNtkNew->pExdc = Abc_NtkDup( pNtk->pExdc );
    }
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkAigToLogicSop(): Network check has failed.\n" );
    return pNtkNew;
}